

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O3

void __thiscall
Eigen::TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>,10u>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>,10u> *this,
          MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  undefined8 uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar6 = _DAT_00133420;
  auVar5 = _DAT_00133410;
  plVar2 = *(long **)this;
  lVar3 = plVar2[1];
  if ((lVar3 == *(long *)other) && (lVar4 = plVar2[2], lVar4 == *(long *)(other + 8))) {
    if (0 < lVar4) {
      lVar7 = *plVar2 + 8;
      lVar8 = 0;
      do {
        lVar9 = lVar8;
        if (lVar3 < lVar8) {
          lVar9 = lVar3;
        }
        if (0 < lVar9) {
          lVar10 = lVar8;
          if (lVar3 < lVar8) {
            lVar10 = lVar3;
          }
          uVar1 = *(undefined8 *)(other + 0x10);
          lVar10 = lVar10 + -1;
          auVar12._8_4_ = (int)lVar10;
          auVar12._0_8_ = lVar10;
          auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar12 = auVar12 ^ auVar6;
          uVar11 = 0;
          auVar13 = auVar5;
          do {
            auVar14 = auVar13 ^ auVar6;
            if ((bool)(~(auVar12._4_4_ < auVar14._4_4_ ||
                        auVar12._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar12._4_4_) & 1)) {
              *(undefined8 *)(lVar7 + -8 + uVar11 * 8) = uVar1;
            }
            if (auVar14._12_4_ <= auVar12._12_4_ &&
                (auVar14._8_4_ <= auVar12._8_4_ || auVar14._12_4_ != auVar12._12_4_)) {
              *(undefined8 *)(lVar7 + uVar11 * 8) = uVar1;
            }
            uVar11 = uVar11 + 2;
            lVar10 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 2;
            auVar13._8_8_ = lVar10 + 2;
          } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar11);
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + lVar3 * 8;
      } while (lVar8 != lVar4);
    }
    return;
  }
  __assert_fail("m_matrix.rows() == other.rows() && m_matrix.cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/TriangularMatrix.h"
                ,0x272,
                "void Eigen::TriangularView<Eigen::Matrix<double, -1, -1>, 10>::lazyAssign(const MatrixBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, Mode = 10, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

void TriangularView<MatrixType, Mode>::lazyAssign(const MatrixBase<OtherDerived>& other)
{
  enum {
    unroll = MatrixType::SizeAtCompileTime != Dynamic
          && internal::traits<OtherDerived>::CoeffReadCost != Dynamic
          && MatrixType::SizeAtCompileTime*internal::traits<OtherDerived>::CoeffReadCost/2 <= EIGEN_UNROLLING_LIMIT
  };
  eigen_assert(m_matrix.rows() == other.rows() && m_matrix.cols() == other.cols());

  internal::triangular_assignment_selector
    <MatrixType, OtherDerived, int(Mode),
    unroll ? int(MatrixType::SizeAtCompileTime) : Dynamic,
    false // do not change the opposite triangular part
    >::run(m_matrix.const_cast_derived(), other.derived());
}